

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_PitchDetector.cpp
# Opt level: O2

int PitchDetector::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float *pfVar1;
  UnityComplexNumber *data;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  EffectData *pEVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  size_t __n;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pEVar7 = UnityAudioEffectState::GetEffectData<PitchDetector::EffectData>(state);
  uVar3 = (state->field_0).field_0.samplerate;
  fVar2 = (pEVar7->field_0).data.p[7];
  fVar14 = exp2f((pEVar7->field_0).data.p[6] / 12.0);
  memcpy(outbuffer,inbuffer,(ulong)(inchannels * length) << 2);
  data = (pEVar7->field_0).data.spec;
  uVar11 = 0;
  uVar8 = 0;
  if (0 < outchannels) {
    uVar8 = (ulong)(uint)outchannels;
  }
  for (uVar12 = 0; uVar12 != length; uVar12 = uVar12 + 1) {
    fVar15 = inbuffer[(uint)((int)uVar12 * inchannels)];
    fVar16 = (pEVar7->field_0).data.env;
    (pEVar7->field_0).data.env = (ABS(fVar15) - fVar16) * 0.01 + fVar16;
    iVar5 = (pEVar7->field_0).data.counter;
    *(float *)((long)&pEVar7->field_0 + (long)iVar5 * 4 + 0x302c) = fVar15;
    iVar5 = iVar5 + 1;
    (pEVar7->field_0).data.counter = iVar5;
    if (iVar5 == 0x400) {
      (pEVar7->field_0).data.counter = 0;
      for (lVar9 = 0x40b; lVar9 != 0x100b; lVar9 = lVar9 + 1) {
        *(undefined4 *)((long)pEVar7 + lVar9 * 4 + -0x1000) =
             *(undefined4 *)((long)&pEVar7->field_0 + lVar9 * 4);
      }
      for (lVar9 = 0x2006; lVar9 != 0x3006; lVar9 = lVar9 + 1) {
        *(float *)((long)pEVar7 + lVar9 * 8 + -4) =
             *(float *)((long)pEVar7 + lVar9 * 4 + -0x7fec) *
             *(float *)((long)pEVar7 + lVar9 * 4 + -0x3fec);
        *(undefined4 *)((long)&pEVar7->field_0 + lVar9 * 8) = 0;
      }
      for (lVar9 = 0x1802c; lVar9 != 0x2002c; lVar9 = lVar9 + 8) {
        *(undefined8 *)((long)&pEVar7->field_0 + lVar9) = 0;
      }
      FFT::Forward(data,0x2000,true);
      iVar5 = (int)(pEVar7->field_0).data.p[2];
      lVar9 = (long)(int)(pEVar7->field_0).data.p[1];
      __n = lVar9 * 8;
      memset(data,0,__n);
      memset(data + iVar5,0,(long)(iVar5 * -2 + 0x2000) << 3);
      memset((void *)((long)pEVar7 + lVar9 * -8 + 0x2002c),0,__n);
      for (lVar9 = 0; lVar9 != 0x8000; lVar9 = lVar9 + 4) {
        fVar15 = *(float *)((long)&pEVar7->field_0 + lVar9 * 2 + 0x1002c);
        fVar16 = *(float *)((long)&pEVar7->field_0 + lVar9 * 2 + 0x10030);
        fVar15 = (fVar15 * fVar15 + fVar16 * fVar16) *
                 *(float *)((long)&pEVar7->field_0 + uVar12 * 4 + 0x802c);
        *(float *)((long)&pEVar7->field_0 + lVar9 * 2 + 0x1002c) = fVar15;
        *(undefined4 *)((long)&pEVar7->field_0 + lVar9 * 2 + 0x10030) = 0;
        *(float *)((long)&debugdata + lVar9) = fVar15;
      }
      FFT::Backward(data,0x2000,true);
      fVar15 = 0.0;
      iVar5 = 0;
      for (lVar9 = (long)(int)(pEVar7->field_0).data.p[3]; lVar9 < (int)(pEVar7->field_0).data.p[4];
          lVar9 = lVar9 + 1) {
        fVar16 = *(float *)((long)&pEVar7->field_0 + lVar9 * 8 + 0x1002c);
        iVar4 = (int)lVar9;
        if (fVar16 <= fVar15) {
          fVar16 = fVar15;
          iVar4 = iVar5;
        }
        iVar5 = iVar4;
        fVar15 = fVar16;
      }
      fVar15 = (pEVar7->field_0).data.p[0];
      fVar16 = (pEVar7->field_0).data.env;
      pfVar1 = (pEVar7->field_0).data.p + 5;
      if ((*pfVar1 <= fVar16 && fVar16 != *pfVar1) && (0 < iVar5)) {
        *(float *)(detected_freqs + (long)(int)fVar15 * 4) =
             (float)(state->field_0).field_0.samplerate / (float)iVar5;
      }
    }
    else {
      fVar15 = (pEVar7->field_0).data.p[0];
    }
    fVar15 = *(float *)(detected_freqs + (long)(int)fVar15 * 4) * fVar14 * (1.0 / (float)uVar3) +
             (pEVar7->field_0).data.phase;
    fVar16 = floorf(fVar15);
    (pEVar7->field_0).data.phase = fVar15 - (float)(int)fVar16;
    uVar10 = uVar8;
    uVar6 = uVar11;
    while( true ) {
      bVar13 = uVar10 == 0;
      uVar10 = uVar10 - 1;
      if (bVar13) break;
      fVar15 = (pEVar7->field_0).data.phase;
      outbuffer[uVar6] =
           ((fVar15 + fVar15 + -1.0) * (pEVar7->field_0).data.env - outbuffer[uVar6]) * fVar2 +
           outbuffer[uVar6];
      uVar6 = uVar6 + 1;
    }
    uVar11 = uVar11 + outchannels;
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        const float sampletime = 1.0f / state->samplerate;
        const float monitor = data->p[P_MONITOR];
        const float oscpitch = powf(2.0f, data->p[P_OSCPITCH] / 12.0f) * sampletime;

        memcpy(outbuffer, inbuffer, length * inchannels * sizeof(float));

        for (unsigned int n = 0; n < length; n++)
        {
            float input = inbuffer[n * inchannels];

            data->env += (fabsf(input) - data->env) * 0.01f;
            data->buffer[data->counter + WINSIZE - HOPSIZE] = input;

            if (++data->counter == HOPSIZE)
            {
                data->counter = 0;

                for (int i = 0; i < WINSIZE - HOPSIZE; i++)
                    data->buffer[i] = data->buffer[i + HOPSIZE];

                for (int i = 0; i < WINSIZE; i++)
                {
                    data->spec[i].re = data->buffer[i] * data->window[i];
                    data->spec[i].im = 0.0f;
                }

                for (int i = WINSIZE; i < FFTSIZE; i++)
                {
                    data->spec[i].re = 0.0f;
                    data->spec[i].im = 0.0f;
                }

                FFT::Forward(data->spec, FFTSIZE, true);

                int locut = (int)data->p[P_LOCUT];
                int hicut = (int)data->p[P_HICUT];
                memset(data->spec, 0, sizeof(UnityComplexNumber) * locut);
                memset(data->spec + hicut, 0, sizeof(UnityComplexNumber) * (FFTSIZE - 2 * hicut));
                memset(data->spec + FFTSIZE - locut, 0, sizeof(UnityComplexNumber) * locut);

                // Fast autocorrelation
                for (int i = 0; i < FFTSIZE; i++)
                {
                    data->spec[i].re = data->spec[i].Magnitude2() * data->acnf[n]; // Correct for windowing
                    data->spec[i].im = 0.0f;
                    debugdata[i] = data->spec[i].re;
                }
                FFT::Backward(data->spec, FFTSIZE, true);

                int startbin = (int)data->p[P_LOBIN];
                int endbin = (int)data->p[P_HIBIN];
                int maxbin = 0;
                float maxval = 0.0f;
                for (int n = startbin; n < endbin; n++)
                {
                    float a = data->spec[n].re;
                    if (a > maxval)
                    {
                        maxbin = n;
                        maxval = a;
                    }
                }

                if (data->env > data->p[P_THR] && maxbin > 0)
                    detected_freqs[(int)data->p[P_INDEX]] = (float)state->samplerate / (float)maxbin;
            }

            data->phase += detected_freqs[(int)data->p[P_INDEX]] * oscpitch;
            data->phase -= FastFloor(data->phase);

            for (int c = 0; c < outchannels; c++)
                outbuffer[n * outchannels + c] += ((data->phase * 2.0f - 1.0f) * data->env - outbuffer[n * outchannels + c]) * monitor;
        }

        return UNITY_AUDIODSP_OK;
    }